

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 jx9MemObjIsNumeric(jx9_value *pObj)

{
  sxu32 nLen;
  sxi32 sVar1;
  sxi32 rc;
  SyString sStr;
  jx9_value *pObj_local;
  
  if ((pObj->iFlags & 0xeU) == 0) {
    if ((pObj->iFlags & 0x160U) == 0) {
      if ((pObj->iFlags & 1U) == 0) {
        pObj_local._4_4_ = 0;
      }
      else {
        nLen = (pObj->sBlob).nByte;
        if (nLen == 0) {
          pObj_local._4_4_ = 0;
        }
        else {
          sVar1 = SyStrIsNumeric((char *)(pObj->sBlob).pBlob,nLen,(sxu8 *)0x0,(char **)0x0);
          pObj_local._4_4_ = (uint)(sVar1 == 0);
        }
      }
    }
    else {
      pObj_local._4_4_ = 0;
    }
  }
  else {
    pObj_local._4_4_ = 1;
  }
  return pObj_local._4_4_;
}

Assistant:

JX9_PRIVATE sxi32 jx9MemObjIsNumeric(jx9_value *pObj)
{
	if( pObj->iFlags & ( MEMOBJ_BOOL|MEMOBJ_INT|MEMOBJ_REAL) ){
		return TRUE;
	}else if( pObj->iFlags & (MEMOBJ_NULL|MEMOBJ_HASHMAP|MEMOBJ_RES) ){
		return FALSE;
	}else if( pObj->iFlags & MEMOBJ_STRING ){
		SyString sStr;
		sxi32 rc;
		SyStringInitFromBuf(&sStr, SyBlobData(&pObj->sBlob), SyBlobLength(&pObj->sBlob));
		if( sStr.nByte <= 0 ){
			/* Empty string */
			return FALSE;
		}
		/* Check if the string representation looks like a numeric number */
		rc = SyStrIsNumeric(sStr.zString, sStr.nByte, 0, 0);
		return rc == SXRET_OK ? TRUE : FALSE;
	}
	/* NOT REACHED */
	return FALSE;
}